

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChValueSpecific<chrono::ChFrameMoving<double>_>::ChValueSpecific
          (ChValueSpecific<chrono::ChFrameMoving<double>_> *this,ChFrameMoving<double> *mvalp,
          char *mname,char flags)

{
  (this->super_ChValue)._name._M_dataplus._M_p = (pointer)&(this->super_ChValue)._name.field_2;
  (this->super_ChValue)._name._M_string_length = 0;
  (this->super_ChValue)._name.field_2._M_local_buf[0] = '\0';
  (this->super_ChValue)._vptr_ChValue = (_func_int **)&PTR__ChValue_0011ecb8;
  this->_ptr_to_val = mvalp;
  strlen(mname);
  std::__cxx11::string::_M_replace((ulong)&(this->super_ChValue)._name,0,(char *)0x0,(ulong)mname);
  (this->super_ChValue)._flags = flags;
  return;
}

Assistant:

ChValueSpecific(TClass& mvalp, const char* mname, char flags) { 
          _ptr_to_val = (TClass*)(& mvalp);
          _name = mname;
          _flags = flags;
      }